

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aTextureMipmapTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Accuracy::Texture2DMipmapCase::init(Texture2DMipmapCase *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int iVar2;
  TestLog *this_00;
  MessageBuilder *this_01;
  Texture2D *this_02;
  Texture2D *pTVar3;
  PixelBufferAccess *access;
  RGBA local_1cc;
  Vec4 local_1c8;
  uint local_1b8;
  uint local_1b4;
  deUint32 color;
  deUint32 rgb;
  deUint32 dec;
  deUint32 inc;
  deUint32 step;
  int levelNdx;
  int numLevels;
  MessageBuilder local_190;
  Texture2DMipmapCase *local_10;
  Texture2DMipmapCase *this_local;
  
  local_10 = this;
  uVar1 = (*this->m_renderCtxInfo->_vptr_ContextInfo[7])();
  if ((uVar1 & 1) == 0) {
    this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_190,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    this_01 = tcu::MessageBuilder::operator<<
                        (&local_190,
                         (char (*) [59])"Warning: High precision not supported in fragment shaders."
                        );
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_190);
  }
  this_02 = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D
            (this_02,this->m_renderCtx,this->m_format,this->m_dataType,this->m_width,this->m_height)
  ;
  this->m_texture = this_02;
  iVar2 = de::max<int>(this->m_width,this->m_height);
  iVar2 = ::deLog2Floor32(iVar2);
  step = iVar2 + 1;
  for (inc = 0; (int)inc < (int)step; inc = inc + 1) {
    dec = (deUint32)(0xff / (long)(int)(step - 1));
    rgb = ::deClamp32(dec * inc,0,0xff);
    color = 0xff - rgb;
    local_1b8 = rgb << 0x10 | color * 0x100;
    local_1b4 = local_1b8 | 0xff;
    local_1b8 = local_1b8 | 0xff0000ff;
    pTVar3 = glu::Texture2D::getRefTexture(this->m_texture);
    tcu::Texture2D::allocLevel(pTVar3,inc);
    pTVar3 = glu::Texture2D::getRefTexture(this->m_texture);
    access = tcu::TextureLevelPyramid::getLevel(&pTVar3->super_TextureLevelPyramid,inc);
    tcu::RGBA::RGBA(&local_1cc,local_1b8);
    tcu::RGBA::toVec((RGBA *)&local_1c8);
    tcu::clear(access,&local_1c8);
  }
  return inc;
}

Assistant:

void Texture2DMipmapCase::init (void)
{
	if (!m_renderCtxInfo.isFragmentHighPrecisionSupported())
		m_testCtx.getLog() << TestLog::Message << "Warning: High precision not supported in fragment shaders." << TestLog::EndMessage;

	m_texture = new Texture2D(m_renderCtx, m_format, m_dataType, m_width, m_height);

	int numLevels = deLog2Floor32(de::max(m_width, m_height))+1;

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		deUint32	step		= 0xff / (numLevels-1);
		deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
		deUint32	dec			= 0xff - inc;
		deUint32	rgb			= (inc << 16) | (dec << 8) | 0xff;
		deUint32	color		= 0xff000000 | rgb;

		m_texture->getRefTexture().allocLevel(levelNdx);
		tcu::clear(m_texture->getRefTexture().getLevel(levelNdx), tcu::RGBA(color).toVec());
	}
}